

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::operator()
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
           *this,basic_string_view<char> value)

{
  basic_buffer<char> *pbVar1;
  size_t sVar2;
  ulong uVar3;
  ulong __n;
  char *data;
  str_writer<char> local_40;
  
  __n = value.size_;
  if (this->specs_ == (format_specs *)0x0) {
    pbVar1 = (this->writer_).out_.container;
    sVar2 = pbVar1->size_;
    uVar3 = sVar2 + __n;
    if (pbVar1->capacity_ < uVar3) {
      (**pbVar1->_vptr_basic_buffer)(pbVar1,uVar3);
    }
    pbVar1->size_ = uVar3;
    if (__n != 0) {
      memmove(pbVar1->ptr_ + sVar2,value.data_,__n);
    }
  }
  else {
    check_string_type_spec<char,fmt::v5::internal::error_handler>
              ((this->specs_->super_core_format_specs).type,(error_handler *)&local_40);
    uVar3 = (ulong)(this->specs_->super_core_format_specs).precision;
    local_40.size_ = __n;
    if (uVar3 < __n) {
      local_40.size_ = uVar3;
    }
    if ((long)uVar3 < 0) {
      local_40.size_ = __n;
    }
    local_40.s = value.data_;
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
    write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::str_writer<char>>
              ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
               this,&this->specs_->super_align_spec,&local_40);
  }
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(
            specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }